

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatterBuffer.c
# Opt level: O0

ZyanStatus ZydisFormatterTokenNext(ZydisFormatterTokenConst **token)

{
  ZyanU8 next;
  ZydisFormatterTokenConst **token_local;
  
  if ((token == (ZydisFormatterTokenConst **)0x0) || (*token == (ZydisFormatterTokenConst *)0x0)) {
    token_local._4_4_ = 0x80100004;
  }
  else if ((*token)->next == 0) {
    token_local._4_4_ = 0x80100008;
  }
  else {
    *token = (ZydisFormatterTokenConst *)(&(*token)[1].type + (int)(uint)(*token)->next);
    token_local._4_4_ = 0x100000;
  }
  return token_local._4_4_;
}

Assistant:

ZyanStatus ZydisFormatterTokenNext(ZydisFormatterTokenConst** token)
{
    if (!token || !*token)
    {
        return ZYAN_STATUS_INVALID_ARGUMENT;
    }

    const ZyanU8 next = (*token)->next;
    if (!next)
    {
        return ZYAN_STATUS_OUT_OF_RANGE;
    }
    *token = (ZydisFormatterTokenConst*)((ZyanU8*)*token + sizeof(ZydisFormatterToken) + next);

    return ZYAN_STATUS_SUCCESS;
}